

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_voice_name(OpenJTalk *oj,char *name)

{
  _Bool _Var1;
  size_t sVar2;
  Open_JTalk *open_jtalk;
  char *__dest;
  char *in_RSI;
  long in_RDI;
  uint *unaff_retaddr;
  char *in_stack_00000008;
  uint c;
  char name_extended [260];
  char temp [260];
  char *in_stack_00000308;
  size_t in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  char local_238 [272];
  char local_128 [272];
  char *local_18;
  long local_10;
  uint in_stack_fffffffffffffffc;
  
  if (((in_RDI != 0) && (in_RSI != (char *)0x0)) &&
     (local_18 = in_RSI, local_10 = in_RDI, sVar2 = strlen(in_RSI), sVar2 != 0)) {
    clear_path_string((char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                      in_stack_fffffffffffffdb8);
    _Var1 = is_name_only(in_stack_00000308);
    if (_Var1) {
      open_jtalk = (Open_JTalk *)strlen(local_18);
      sVar2 = strlen(G_VOICE_EXT);
      if (0x104 < (long)&(open_jtalk->mecab).feature + sVar2 + 1) {
        return false;
      }
      __dest = strcpy(local_238,local_18);
      strcat(__dest,G_VOICE_EXT);
      _Var1 = search_file_recursive
                        ((char *)name_extended._8_8_,(char *)name_extended._0_8_,in_stack_00000008,
                         unaff_retaddr,in_stack_fffffffffffffffc);
      if (_Var1) {
        strcpy((char *)(local_10 + 0x210),local_128);
        Open_JTalk_load_voice(open_jtalk,(char *)0x1969e5);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool set_voice_name(OpenJTalk *oj, const char *name)
{
	if (!oj)
	{
		return false;
	}

	if (name == NULL || strlen(name) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	if (is_name_only(name))
	{
		if (strlen(name) + strlen(G_VOICE_EXT) + 1 > MAX_PATH)
		{
			return false;
		}

		char name_extended[MAX_PATH];
		strcat(strcpy(name_extended, name), G_VOICE_EXT);
		unsigned int c = 0;
		if (search_file_recursive(oj->dn_voice_dir_path, name_extended, temp, &c, VOICESEARCHMAX))
		{
			goto return_true;
		}
	}

	return false;

return_true:
	strcpy(oj->fn_voice_path, temp);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(temp, temp2);
	Open_JTalk_load_voice(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_voice(oj->open_jtalk, temp);
#endif
	return true;
}